

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O1

uint32_t __thiscall protozero::Message::Finalize(Message *this)

{
  uint8_t *puVar1;
  uint32_t uVar2;
  uint uVar3;
  size_t i;
  ulong uVar4;
  
  if (this->finalized_ == false) {
    if (this->nested_message_ != (Message *)0x0) {
      uVar2 = Finalize(this->nested_message_);
      this->size_ = this->size_ + uVar2;
      MessageArena::DeleteLastMessageInternal(this->arena_);
      this->nested_message_ = (Message *)0x0;
    }
    puVar1 = this->size_field_;
    if (puVar1 != (uint8_t *)0x0) {
      uVar3 = this->size_ - this->size_already_written_;
      uVar4 = 0;
      do {
        puVar1[uVar4] = (uVar4 < 3) << 7 | (byte)uVar3;
        uVar3 = uVar3 >> 7;
        uVar4 = uVar4 + 1;
      } while (uVar4 != 4);
      this->size_field_ = (uint8_t *)0x0;
    }
    this->finalized_ = true;
  }
  return this->size_;
}

Assistant:

uint32_t Message::Finalize() {
  if (finalized_)
    return size_;

  if (nested_message_)
    EndNestedMessage();

  // Write the length of the nested message a posteriori, using a leading-zero
  // redundant varint encoding.
  if (size_field_) {
    PERFETTO_DCHECK(!finalized_);
    PERFETTO_DCHECK(size_ < proto_utils::kMaxMessageLength);
    PERFETTO_DCHECK(size_ >= size_already_written_);
    proto_utils::WriteRedundantVarInt(size_ - size_already_written_,
                                      size_field_);
    size_field_ = nullptr;
  }

  finalized_ = true;
#if PERFETTO_DCHECK_IS_ON()
  if (handle_)
    handle_->reset_message();
#endif

  return size_;
}